

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::internal::ArenaImpl::SerialArena::SpaceUsed(SerialArena *this)

{
  char *pcVar1;
  char *pcVar2;
  Block *pBVar3;
  long lVar4;
  
  pcVar1 = this->ptr_;
  pcVar2 = Block::Pointer(this->head_,0x18);
  lVar4 = (long)pcVar1 - (long)pcVar2;
  pBVar3 = this->head_;
  while (pBVar3 = pBVar3->next_, pBVar3 != (Block *)0x0) {
    lVar4 = lVar4 + pBVar3->pos_ + -0x18;
  }
  return lVar4 - 0x48;
}

Assistant:

uint64 ArenaImpl::SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= kSerialArenaSize;
  return space_used;
}